

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL GetFileSizeEx(HANDLE hFile,PLARGE_INTEGER lpFileSize)

{
  DWORD local_30;
  DWORD local_2c;
  DWORD dwFileSizeLow;
  DWORD dwFileSizeHigh;
  CPalThread *pThread;
  PLARGE_INTEGER p_Stack_18;
  PAL_ERROR palError;
  PLARGE_INTEGER lpFileSize_local;
  HANDLE hFile_local;
  
  pThread._4_4_ = 0;
  p_Stack_18 = lpFileSize;
  lpFileSize_local = (PLARGE_INTEGER)hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  _dwFileSizeLow = CorUnix::InternalGetCurrentThread();
  if (p_Stack_18 == (PLARGE_INTEGER)0x0) {
    pThread._4_4_ = 0x57;
  }
  else {
    pThread._4_4_ =
         CorUnix::InternalGetFileSize(_dwFileSizeLow,lpFileSize_local,&local_30,&local_2c);
    (p_Stack_18->field_0).LowPart = local_30;
    (p_Stack_18->field_0).HighPart = local_2c;
  }
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(pThread._4_4_ == 0);
}

Assistant:

BOOL
PALAPI GetFileSizeEx(
IN   HANDLE hFile,
OUT  PLARGE_INTEGER lpFileSize)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileSizeHigh;
    DWORD dwFileSizeLow;

    PERF_ENTRY(GetFileSizeEx);
    ENTRY("GetFileSizeEx(hFile=%p, lpFileSize=%p)\n", hFile, lpFileSize);

    pThread = InternalGetCurrentThread();

    if (lpFileSize != NULL)
    {
        palError = InternalGetFileSize(
            pThread,
            hFile,
            &dwFileSizeLow,
            &dwFileSizeHigh
            );

        lpFileSize->u.LowPart = dwFileSizeLow;
        lpFileSize->u.HighPart = dwFileSizeHigh;
    }
    else
    {
        palError = ERROR_INVALID_PARAMETER;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("GetFileSizeEx returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(GetFileSizeEx);
    return NO_ERROR == palError;
}